

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledFont8x16.cxx
# Opt level: O1

OledPoint SSD1306::drawString8x16(OledPoint *p,char *string,PixelStyle style,OledPixel *oled)

{
  uint8_t c;
  int iVar1;
  int iVar2;
  int iVar3;
  OledPoint local_38;
  
  local_38 = *p;
  if (string == (char *)0x0) {
    return local_38;
  }
  iVar1 = local_38.m_x;
  iVar3 = local_38.m_x;
  iVar2 = local_38.m_y;
  do {
    c = *string;
    if (c == '\n') {
      iVar2 = iVar2 + 0x10;
      local_38.m_y = iVar2;
      local_38.m_x = iVar1;
      iVar3 = iVar1;
    }
    else {
      if (c == '\0') {
        return local_38;
      }
      drawChar8x16(&local_38,c,style,oled);
      local_38.m_x = iVar3 + 8;
      iVar3 = iVar3 + 8;
    }
    string = (char *)((uint8_t *)string + 1);
  } while( true );
}

Assistant:

SSD1306::OledPoint
SSD1306::drawString8x16(
    const OledPoint& p,
    const char* string,
    PixelStyle style,
    OledPixel& oled)
{
    OledPoint position{p};

    if (string != nullptr)
    {
        OledPoint start{p};

        while (*string != '\0')
        {
            if (*string == '\n')
            {
                position.set(
                    start.x(),
                    position.y() + sc_fontHeight8x16);
            }
            else
            {
                drawChar8x16(position, *string, style, oled);

                position.set(
                    position.x() + sc_fontWidth8x16,
                    position.y());
            }
            ++string;
        }
    }

    return position;
}